

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLineNurbs.cpp
# Opt level: O1

void __thiscall chrono::geometry::ChLineNurbs::ChLineNurbs(ChLineNurbs *this)

{
  initializer_list<chrono::ChVector<double>_> __l;
  vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_> mpoints;
  allocator_type local_61;
  vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_> local_60;
  undefined1 local_48 [24];
  undefined8 local_30;
  undefined1 local_28 [16];
  
  (this->super_ChLine).closed = false;
  (this->super_ChLine).complexityU = 2;
  (this->super_ChLine).super_ChGeometry._vptr_ChGeometry = (_func_int **)&PTR__ChLineNurbs_00b65eb8;
  (this->points).
  super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->points).
  super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->points).
  super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->weights).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)0x0;
  (this->weights).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)0x0;
  (this->weights).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
       0;
  (this->knots).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)0x0;
  (this->knots).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
  local_48._0_8_ = -1.0;
  local_48._8_16_ = ZEXT416(0) << 0x40;
  local_30 = 0x3ff0000000000000;
  __l._M_len = 2;
  __l._M_array = (iterator)local_48;
  local_28 = local_48._8_16_;
  std::vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>::vector
            (&local_60,__l,&local_61);
  (*(this->super_ChLine).super_ChGeometry._vptr_ChGeometry[0x15])(this,1,&local_60,0,0);
  if (local_60.
      super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_60.
                    super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_60.
                          super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_60.
                          super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

ChLineNurbs::ChLineNurbs() {
    std::vector<ChVector<> > mpoints = {ChVector<>(-1, 0, 0), ChVector<>(1, 0, 0)};
    this->SetupData(1, mpoints);
}